

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::TransformFeedback::BasicArrayCase::~BasicArrayCase(BasicArrayCase *this)

{
  TransformFeedbackCase::~TransformFeedbackCase(&this->super_TransformFeedbackCase);
  operator_delete(this,0x148);
  return;
}

Assistant:

BasicArrayCase (Context& context, const char* name, const char* desc, deUint32 bufferType, deUint32 primitiveType, glu::DataType type, glu::Precision precision, Interpolation interpolation)
		: TransformFeedbackCase(context, name, desc, bufferType, primitiveType)
	{
		if (glu::isDataTypeMatrix(type) || m_bufferMode == GL_SEPARATE_ATTRIBS)
		{
			// \note For matrix types we need to use reduced array sizes or otherwise we will exceed maximum attribute (16)
			//		 or transform feedback component count (64).
			//		 On separate attribs mode maximum component count per varying is 4.
			m_progSpec.addVarying("v_varA", glu::VarType(glu::VarType(type, precision), 1), interpolation);
			m_progSpec.addVarying("v_varB", glu::VarType(glu::VarType(type, precision), 2), interpolation);
		}
		else
		{
			m_progSpec.addVarying("v_varA", glu::VarType(glu::VarType(type, precision), 3), interpolation);
			m_progSpec.addVarying("v_varB", glu::VarType(glu::VarType(type, precision), 4), interpolation);
		}

		m_progSpec.addTransformFeedbackVarying("v_varA");
		m_progSpec.addTransformFeedbackVarying("v_varB");
	}